

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::text_format_unittest::AbslStringifyTest_StringifyMetaAnnotatedIsRedacted_Test::
TestBody(AbslStringifyTest_StringifyMetaAnnotatedIsRedacted_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *message;
  size_t in_R9;
  string_view value;
  string_view format;
  AssertionResult gtest_ar;
  string result;
  TestRedactedMessage proto;
  char local_138 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_130;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_128;
  char *local_120;
  long local_118;
  char *local_110;
  AssertHelper local_100;
  undefined8 local_f8;
  undefined1 local_f0 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d8;
  undefined1 local_d0;
  StringifySink local_c8;
  PolymorphicMatcher<testing::internal::MatchesRegexMatcher> local_a0;
  undefined1 local_88 [104];
  StringLike<std::__cxx11::basic_string<char>_> *regex;
  
  proto2_unittest::TestRedactedMessage::TestRedactedMessage
            ((TestRedactedMessage *)local_88,(Arena *)0x0);
  local_88[0x10] = local_88[0x10] | 2;
  if ((local_88._8_8_ & 1) != 0) {
    local_88._8_8_ = *(undefined8 *)(local_88._8_8_ & 0xfffffffffffffffe);
  }
  value._M_str = "foo";
  value._M_len = 3;
  protobuf::internal::ArenaStringPtr::Set
            ((ArenaStringPtr *)(local_88 + 0x20),value,(Arena *)local_88._8_8_);
  local_f8 = 0;
  local_f0[0] = 0;
  local_128._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0xe;
  local_120 = "goo\\.gle/.+  +";
  local_118 = 0xc;
  local_110 = "\\[REDACTED\\]";
  format._M_str = (char *)&local_128;
  format._M_len = (size_t)"$0\nmeta_annotated: $1\n";
  local_100.data_ = (AssertHelperData *)local_f0;
  absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
            ((substitute_internal *)&local_100,(Nonnull<std::string_*>)&DAT_00000016,format,
             (Nullable<const_absl::string_view_*>)0x2,in_R9);
  testing::MatchesRegex<std::__cxx11::string>(&local_a0,(testing *)&local_100,regex);
  if (local_a0.impl_.regex_.
      super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_a0.impl_.regex_.
       super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      )->_M_use_count =
           (local_a0.impl_.regex_.
            super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_a0.impl_.regex_.
       super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      )->_M_use_count =
           (local_a0.impl_.regex_.
            super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  local_f0._16_8_ =
       local_a0.impl_.regex_.
       super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_d8 = local_a0.impl_.regex_.
             super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ._M_pi;
  if (local_a0.impl_.regex_.
      super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_d0 = local_a0.impl_.full_match_;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_a0.impl_.regex_.
       super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      )->_M_use_count =
           (local_a0.impl_.regex_.
            super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_a0.impl_.regex_.
       super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      )->_M_use_count =
           (local_a0.impl_.regex_.
            super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
    local_d0 = local_a0.impl_.full_match_;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a0.impl_.regex_.
               super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  paVar1 = &local_c8.buffer_.field_2;
  local_c8.buffer_.field_2._8_8_ = 0;
  local_c8.buffer_._M_string_length = 0;
  local_c8.buffer_.field_2._M_allocated_capacity = 0;
  local_c8.buffer_._M_dataplus._M_p = (pointer)paVar1;
  AbslStringify<absl::lts_20250127::strings_internal::StringifySink>(&local_c8,(Message *)local_88);
  local_128._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_118;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_128,local_c8.buffer_._M_dataplus._M_p,
             local_c8.buffer_._M_dataplus._M_p + local_c8.buffer_._M_string_length);
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::MatchesRegexMatcher>>
  ::operator()(local_138,local_f0 + 0x10,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               "absl::StrCat(proto)");
  if (local_128._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_118) {
    operator_delete(local_128._M_head_impl,local_118 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.buffer_._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8.buffer_._M_dataplus._M_p,
                    local_c8.buffer_.field_2._M_allocated_capacity + 1);
  }
  if (local_d8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8);
  }
  if (local_a0.impl_.regex_.
      super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a0.impl_.regex_.
               super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_100.data_ != (AssertHelperData *)local_f0) {
    operator_delete(local_100.data_,CONCAT71(local_f0._1_7_,local_f0[0]) + 1);
  }
  if (local_138[0] == '\0') {
    testing::Message::Message((Message *)&local_128);
    if (local_130 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = anon_var_dwarf_a12c75 + 5;
    }
    else {
      message = (local_130->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format_unittest.cc"
               ,0xaaa,message);
    testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_128);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    if (local_128._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_128._M_head_impl + 8))();
    }
  }
  if (local_130 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_130,local_130);
  }
  proto2_unittest::TestRedactedMessage::~TestRedactedMessage((TestRedactedMessage *)local_88);
  return;
}

Assistant:

TEST(AbslStringifyTest, StringifyMetaAnnotatedIsRedacted) {
  unittest::TestRedactedMessage proto;
  proto.set_meta_annotated("foo");
  EXPECT_THAT(absl::StrCat(proto), testing::MatchesRegex(absl::Substitute(
                                       "$0\n"
                                       "meta_annotated: $1\n",
                                       kTextMarkerRegex, value_replacement)));
}